

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test::testBody
          (TEST_MemoryLeakWarningThreadSafe_turnOnThreadSafeNewDeleteOverloadsDebug_Test *this)

{
  int iVar1;
  MemoryLeakDetector *pMVar2;
  size_t sVar3;
  void *mem;
  UtestShell *pUVar4;
  size_t sVar5;
  TestTerminator *pTVar6;
  char *pcVar7;
  char *pcVar8;
  SimpleString local_58;
  SimpleString local_48;
  void *local_38;
  
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar3 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();
  local_38 = operator_new(4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                          ,0x1c9);
  mem = operator_new__(0x14,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                       ,0x1ca);
  pUVar4 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,sVar3 + 2,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks + 2, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1cc,pTVar6);
  iVar1 = mutexLockCount;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1cd,pTVar6);
  }
  else {
    StringFrom((int)&local_48);
    pcVar7 = SimpleString::asCharString(&local_48);
    StringFrom((int)&local_58);
    pcVar8 = SimpleString::asCharString(&local_58);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1cd,pTVar6);
    SimpleString::~SimpleString(&local_58);
    SimpleString::~SimpleString(&local_48);
  }
  iVar1 = mutexUnlockCount;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 2) {
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1ce,pTVar6);
  }
  else {
    StringFrom((int)&local_48);
    pcVar7 = SimpleString::asCharString(&local_48);
    StringFrom((int)&local_58);
    pcVar8 = SimpleString::asCharString(&local_58);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1ce,pTVar6);
    SimpleString::~SimpleString(&local_58);
    SimpleString::~SimpleString(&local_48);
  }
  if (mem != (void *)0x0) {
    operator_delete__(mem);
  }
  operator_delete(local_38,4);
  pUVar4 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getGlobalDetector();
  sVar5 = MemoryLeakDetector::totalMemoryLeaks(pMVar2,mem_leak_period_all);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,sVar3,sVar5,
             "LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x1d3,pTVar6);
  iVar1 = mutexLockCount;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 4) {
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d4,pTVar6);
  }
  else {
    StringFrom((int)&local_48);
    pcVar7 = SimpleString::asCharString(&local_48);
    StringFrom((int)&local_58);
    pcVar8 = SimpleString::asCharString(&local_58);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d4,pTVar6);
    SimpleString::~SimpleString(&local_58);
    SimpleString::~SimpleString(&local_48);
  }
  iVar1 = mutexUnlockCount;
  pUVar4 = UtestShell::getCurrent();
  if (iVar1 == 4) {
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d5,pTVar6);
  }
  else {
    StringFrom((int)&local_48);
    pcVar7 = SimpleString::asCharString(&local_48);
    StringFrom((int)&local_58);
    pcVar8 = SimpleString::asCharString(&local_58);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar7,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
               ,0x1d5,pTVar6);
    SimpleString::~SimpleString(&local_58);
    SimpleString::~SimpleString(&local_48);
  }
  MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningThreadSafe, turnOnThreadSafeNewDeleteOverloadsDebug)
{
    size_t storedAmountOfLeaks = MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all);

    MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads();

    int *n = new int;
    char *str = new char[20];

    LONGS_EQUAL(storedAmountOfLeaks + 2, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(2, mutexLockCount);
    CHECK_EQUAL(2, mutexUnlockCount);

    delete [] str;
    delete n;

    LONGS_EQUAL(storedAmountOfLeaks, MemoryLeakWarningPlugin::getGlobalDetector()->totalMemoryLeaks(mem_leak_period_all));
    CHECK_EQUAL(4, mutexLockCount);
    CHECK_EQUAL(4, mutexUnlockCount);

    MemoryLeakWarningPlugin::turnOnDefaultNotThreadSafeNewDeleteOverloads();
}